

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalNestedLoopJoinState::~PhysicalNestedLoopJoinState(PhysicalNestedLoopJoinState *this)

{
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__PhysicalNestedLoopJoinState_027bac80;
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&(this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>)
  ;
  DataChunk::~DataChunk(&this->right_payload);
  DataChunk::~DataChunk(&this->right_condition);
  ColumnDataScanState::~ColumnDataScanState(&this->payload_scan_state);
  ColumnDataScanState::~ColumnDataScanState(&this->condition_scan_state);
  ExpressionExecutor::~ExpressionExecutor(&this->lhs_executor);
  DataChunk::~DataChunk(&this->left_condition);
  CachingOperatorState::~CachingOperatorState(&this->super_CachingOperatorState);
  return;
}

Assistant:

PhysicalNestedLoopJoinState(ClientContext &context, const PhysicalNestedLoopJoin &op,
	                            const vector<JoinCondition> &conditions)
	    : fetch_next_left(true), fetch_next_right(false), lhs_executor(context), left_tuple(0), right_tuple(0),
	      left_outer(IsLeftOuterJoin(op.join_type)) {
		vector<LogicalType> condition_types;
		for (auto &cond : conditions) {
			lhs_executor.AddExpression(*cond.left);
			condition_types.push_back(cond.left->return_type);
		}
		auto &allocator = Allocator::Get(context);
		left_condition.Initialize(allocator, condition_types);
		right_condition.Initialize(allocator, condition_types);
		right_payload.Initialize(allocator, op.children[1].get().GetTypes());
		left_outer.Initialize(STANDARD_VECTOR_SIZE);
	}